

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void soul::SanityCheckPass::runPostResolutionChecks(ModuleBase *module)

{
  ASTVisitor local_78;
  undefined8 *puStack_70;
  undefined8 local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  checkOverallStructure(module);
  puStack_70 = &local_58;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78._vptr_ASTVisitor = (_func_int **)&PTR__PostResolutionChecks_002d8c48;
  local_68 = 0;
  uStack_60 = 8;
  ASTVisitor::visitObject(&local_78,module);
  local_78._vptr_ASTVisitor = (_func_int **)&PTR__PostResolutionChecks_002d8c48;
  local_68 = 0;
  if ((8 < uStack_60) && (puStack_70 != (undefined8 *)0x0)) {
    operator_delete__(puStack_70);
  }
  return;
}

Assistant:

static void runPostResolutionChecks (AST::ModuleBase& module)
    {
        checkOverallStructure (module);
        PostResolutionChecks().ASTVisitor::visitObject (module);
    }